

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_getlastmodtime(char *args)

{
  int iVar1;
  undefined8 uVar2;
  char local_78 [8];
  char modstr [64];
  PHYSFS_Stat statbuf;
  char *args_local;
  
  iVar1 = PHYSFS_stat(args,modstr + 0x38);
  if (iVar1 == 0) {
    uVar2 = PHYSFS_getLastError();
    printf("Failed to determine. Reason: [%s].\n",uVar2);
  }
  else {
    modTimeToStr(statbuf.filesize,local_78,0x40);
    printf("Last modified: %s (%ld).\n",local_78,statbuf.filesize);
  }
  return 1;
}

Assistant:

static int cmd_getlastmodtime(char *args)
{
    PHYSFS_Stat statbuf;
    if (!PHYSFS_stat(args, &statbuf))
        printf("Failed to determine. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        char modstr[64];
        modTimeToStr(statbuf.modtime, modstr, sizeof (modstr));
        printf("Last modified: %s (%ld).\n", modstr, (long) statbuf.modtime);
    } /* else */

    return 1;
}